

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zonevector.cpp
# Opt level: O1

Error __thiscall
asmjit::ZoneBitVector::_resize
          (ZoneBitVector *this,ZoneAllocator *allocator,uint32_t newSize,uint32_t idealCapacity,
          bool newBitsValue)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  sbyte sVar3;
  Error EVar4;
  sbyte sVar5;
  uint uVar6;
  ulong uVar7;
  BitWord BVar8;
  ulong unaff_RBX;
  uint uVar9;
  char cVar10;
  ZoneAllocator *pZVar11;
  BaseAssembler *pBVar12;
  BaseAssembler *this_00;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  ulong unaff_R12;
  BitWord *unaff_R13;
  ZoneBitVector *unaff_R14;
  BitWord *unaff_R15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  size_t allocatedCapacity;
  uint local_4c;
  CodeHolder *local_40;
  ulong local_38;
  
  uVar13 = (ulong)newBitsValue;
  if (newSize <= idealCapacity) {
    unaff_RBX = (ulong)newSize;
    uVar6 = this->_size;
    unaff_R12 = (ulong)uVar6;
    if (newSize <= uVar6) {
      if ((newSize & 0x3f) != 0) {
        this->_data[newSize >> 6] = this->_data[newSize >> 6] & ~(-1L << (sbyte)(newSize & 0x3f));
      }
      goto LAB_001259dc;
    }
    unaff_R15 = this->_data;
    if (newSize <= this->_capacity) goto LAB_001258a6;
    uVar9 = idealCapacity + 0x3f & 0xffffffc0;
    unaff_R14 = this;
    if (uVar9 < newSize) goto LAB_00125a2a;
    if (allocator->_zone != (Zone *)0x0) {
      local_4c = (uint)newBitsValue;
      pZVar11 = allocator;
      unaff_R13 = (BitWord *)ZoneAllocator::_alloc(allocator,(ulong)(uVar9 >> 3),&local_38);
      pBVar12 = (BaseAssembler *)CONCAT71((int7)((ulong)pZVar11 >> 8),unaff_R13 != (BitWord *)0x0);
      if (unaff_R13 != (BitWord *)0x0) {
        uVar13 = local_38 * 8;
        local_40 = (CodeHolder *)allocator;
        if (uVar13 < local_38) goto LAB_00125a36;
        goto LAB_00125860;
      }
LAB_00125893:
      cVar10 = (char)pBVar12;
      uVar13 = (ulong)local_4c;
      goto LAB_00125898;
    }
    pBVar12 = (BaseAssembler *)this;
    _resize();
LAB_00125a36:
    uVar13 = (ulong)uVar9;
LAB_00125860:
    if (0x3f < uVar6 + 0x3f) {
      uVar7 = 0;
      do {
        unaff_R13[uVar7] = unaff_R15[uVar7];
        uVar7 = uVar7 + 1;
      } while (uVar6 + 0x3f >> 6 != uVar7);
    }
    if (unaff_R15 == (BitWord *)0x0) {
LAB_00125889:
      this->_data = unaff_R13;
      this->_capacity = (uint32_t)uVar13;
      unaff_R15 = unaff_R13;
      goto LAB_00125893;
    }
    this_00 = pBVar12;
    if (local_40->_environment != (Environment)0x0) {
      this_00 = (BaseAssembler *)(ulong)this->_capacity;
      if (this->_capacity < 8) goto LAB_00125a48;
      _resize();
      pBVar12 = (BaseAssembler *)((ulong)pBVar12 & 0xffffffff);
      goto LAB_00125889;
    }
LAB_00125a43:
    _resize();
LAB_00125a48:
    _resize();
    BaseAssembler::BaseAssembler(this_00);
    (this_00->super_BaseEmitter)._vptr_BaseEmitter = (_func_int **)&PTR__Assembler_00159938;
    if (local_40 == (CodeHolder *)0x0) {
      return 0x159938;
    }
    EVar4 = CodeHolder::attach(local_40,&this_00->super_BaseEmitter);
    return EVar4;
  }
  _resize();
LAB_00125a2a:
  cVar10 = '\0';
  this = unaff_R14;
LAB_00125898:
  if (cVar10 == '\0') {
    return 1;
  }
LAB_001258a6:
  this_00 = (BaseAssembler *)(unaff_R12 >> 6 & 0x3ffffff);
  uVar6 = (uint)this_00;
  newSize = (uint32_t)unaff_RBX;
  sVar3 = (sbyte)(newSize & 0x3f);
  BVar8 = -(uVar13 & 0xff);
  uVar9 = (uint)unaff_R12 & 0x3f;
  if ((unaff_R12 & 0x3f) != 0) {
    local_40 = (CodeHolder *)(unaff_RBX >> 6 & 0x3ffffff);
    sVar5 = 0;
    if ((uVar6 == (uint)local_40) && (sVar5 = sVar3, (newSize & 0x3f) <= uVar9)) {
      _resize();
      goto LAB_00125a43;
    }
    unaff_R15[(long)this_00] = unaff_R15[(long)this_00] | BVar8 << (sVar5 - (char)uVar9 & 0x3fU);
    uVar6 = uVar6 + 1;
  }
  auVar2 = _DAT_0013ba60;
  auVar1 = _DAT_0013ba50;
  uVar9 = newSize + 0x3f >> 6;
  if (uVar6 < uVar9) {
    uVar7 = (ulong)uVar6;
    lVar14 = (uVar9 - uVar7) + -1;
    auVar16._8_4_ = (int)lVar14;
    auVar16._0_8_ = lVar14;
    auVar16._12_4_ = (int)((ulong)lVar14 >> 0x20);
    uVar15 = 0;
    auVar16 = auVar16 ^ _DAT_0013ba60;
    do {
      auVar17._8_4_ = (int)uVar15;
      auVar17._0_8_ = uVar15;
      auVar17._12_4_ = (int)(uVar15 >> 0x20);
      auVar17 = (auVar17 | auVar1) ^ auVar2;
      if ((bool)(~(auVar17._4_4_ == auVar16._4_4_ && auVar16._0_4_ < auVar17._0_4_ ||
                  auVar16._4_4_ < auVar17._4_4_) & 1)) {
        unaff_R15[uVar7 + uVar15] = BVar8;
      }
      if ((auVar17._12_4_ != auVar16._12_4_ || auVar17._8_4_ <= auVar16._8_4_) &&
          auVar17._12_4_ <= auVar16._12_4_) {
        unaff_R15[uVar7 + uVar15 + 1] = BVar8;
      }
      uVar15 = uVar15 + 2;
    } while (((uVar9 - uVar7) + 1 & 0xfffffffffffffffe) != uVar15);
  }
  if ((unaff_RBX & 0x3f) != 0) {
    uVar7 = 0;
    if ((char)uVar13 != '\0') {
      uVar7 = ~(-1L << sVar3);
    }
    unaff_R15[uVar9 - 1] = uVar7;
  }
LAB_001259dc:
  this->_size = newSize;
  return 0;
}

Assistant:

Error ZoneBitVector::_resize(ZoneAllocator* allocator, uint32_t newSize, uint32_t idealCapacity, bool newBitsValue) noexcept {
  ASMJIT_ASSERT(idealCapacity >= newSize);

  if (newSize <= _size) {
    // The size after the resize is lesser than or equal to the current size.
    uint32_t idx = newSize / kBitWordSizeInBits;
    uint32_t bit = newSize % kBitWordSizeInBits;

    // Just set all bits outside of the new size in the last word to zero.
    // There is a case that there are not bits to set if `bit` is zero. This
    // happens when `newSize` is a multiply of `kBitWordSizeInBits` like 64, 128,
    // and so on. In that case don't change anything as that would mean settings
    // bits outside of the `_size`.
    if (bit)
      _data[idx] &= (BitWord(1) << bit) - 1u;

    _size = newSize;
    return kErrorOk;
  }

  uint32_t oldSize = _size;
  BitWord* data = _data;

  if (newSize > _capacity) {
    // Realloc needed, calculate the minimum capacity (in bytes) requied.
    uint32_t minimumCapacityInBits = Support::alignUp<uint32_t>(idealCapacity, kBitWordSizeInBits);

    if (ASMJIT_UNLIKELY(minimumCapacityInBits < newSize))
      return DebugUtils::errored(kErrorOutOfMemory);

    // Normalize to bytes.
    uint32_t minimumCapacity = minimumCapacityInBits / 8;
    size_t allocatedCapacity;

    BitWord* newData = static_cast<BitWord*>(allocator->alloc(minimumCapacity, allocatedCapacity));
    if (ASMJIT_UNLIKELY(!newData))
      return DebugUtils::errored(kErrorOutOfMemory);

    // `allocatedCapacity` now contains number in bytes, we need bits.
    size_t allocatedCapacityInBits = allocatedCapacity * 8;

    // Arithmetic overflow should normally not happen. If it happens we just
    // change the `allocatedCapacityInBits` to the `minimumCapacityInBits` as
    // this value is still safe to be used to call `_allocator->release(...)`.
    if (ASMJIT_UNLIKELY(allocatedCapacityInBits < allocatedCapacity))
      allocatedCapacityInBits = minimumCapacityInBits;

    _copyBits(newData, data, _wordsPerBits(oldSize));

    if (data)
      allocator->release(data, _capacity / 8);
    data = newData;

    _data = data;
    _capacity = uint32_t(allocatedCapacityInBits);
  }

  // Start (of the old size) and end (of the new size) bits
  uint32_t idx = oldSize / kBitWordSizeInBits;
  uint32_t startBit = oldSize % kBitWordSizeInBits;
  uint32_t endBit = newSize % kBitWordSizeInBits;

  // Set new bits to either 0 or 1. The `pattern` is used to set multiple
  // bits per bit-word and contains either all zeros or all ones.
  BitWord pattern = Support::bitMaskFromBool<BitWord>(newBitsValue);

  // First initialize the last bit-word of the old size.
  if (startBit) {
    uint32_t nBits = 0;

    if (idx == (newSize / kBitWordSizeInBits)) {
      // The number of bit-words is the same after the resize. In that case
      // we need to set only bits necessary in the current last bit-word.
      ASMJIT_ASSERT(startBit < endBit);
      nBits = endBit - startBit;
    }
    else {
      // There is be more bit-words after the resize. In that case we don't
      // have to be extra careful about the last bit-word of the old size.
      nBits = kBitWordSizeInBits - startBit;
    }

    data[idx++] |= pattern << nBits;
  }

  // Initialize all bit-words after the last bit-word of the old size.
  uint32_t endIdx = _wordsPerBits(newSize);
  while (idx < endIdx) data[idx++] = pattern;

  // Clear unused bits of the last bit-word.
  if (endBit)
    data[endIdx - 1] = pattern & ((BitWord(1) << endBit) - 1);

  _size = newSize;
  return kErrorOk;
}